

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

uint32_t WebPDemuxGetI(WebPDemuxer *dmux,WebPFormatFeature feature)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if (dmux != (WebPDemuxer *)0x0) {
    uVar1 = 0;
    switch(feature) {
    case WEBP_FF_FORMAT_FLAGS:
      return dmux->feature_flags;
    case WEBP_FF_CANVAS_WIDTH:
      return dmux->canvas_width;
    case WEBP_FF_CANVAS_HEIGHT:
      return dmux->canvas_height;
    case WEBP_FF_LOOP_COUNT:
      return dmux->loop_count;
    case WEBP_FF_BACKGROUND_COLOR:
      return dmux->bgcolor;
    case WEBP_FF_FRAME_COUNT:
      uVar1 = dmux->num_frames;
    }
  }
  return uVar1;
}

Assistant:

uint32_t WebPDemuxGetI(const WebPDemuxer* dmux, WebPFormatFeature feature) {
  if (dmux == NULL) return 0;

  switch (feature) {
    case WEBP_FF_FORMAT_FLAGS:     return dmux->feature_flags;
    case WEBP_FF_CANVAS_WIDTH:     return (uint32_t)dmux->canvas_width;
    case WEBP_FF_CANVAS_HEIGHT:    return (uint32_t)dmux->canvas_height;
    case WEBP_FF_LOOP_COUNT:       return (uint32_t)dmux->loop_count;
    case WEBP_FF_BACKGROUND_COLOR: return dmux->bgcolor;
    case WEBP_FF_FRAME_COUNT:      return (uint32_t)dmux->num_frames;
  }
  return 0;
}